

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  xml_node xVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  xml_node local_20;
  
  uVar2 = 0;
  uVar3 = 0;
  if (parent._root != (xml_node_struct *)0x0) {
    uVar3 = (uint)(parent._root)->header & 0xf;
  }
  if (child._root != (xml_node_struct *)0x0) {
    uVar2 = (uint)(child._root)->header & 0xf;
  }
  if ((1 < uVar2 && 0xfffffffd < uVar3 - 3) && ((uVar3 == 1 || (uVar2 - 9 < 0xfffffffe)))) {
    if (parent._root == (xml_node_struct *)0x0) {
      xml_node::xml_node(&local_20);
    }
    else {
      xml_node::xml_node(&local_20,
                         (xml_node_struct *)
                         (*(long *)((long)parent._root - ((parent._root)->header >> 8)) + -0x40));
    }
    xVar1._root = local_20._root;
    if (child._root == (xml_node_struct *)0x0) {
      xml_node::xml_node(&local_20);
    }
    else {
      xml_node::xml_node(&local_20,
                         (xml_node_struct *)
                         (*(long *)((long)child._root - ((child._root)->header >> 8)) + -0x40));
    }
    if (xVar1._root == local_20._root) {
      if (parent._root == child._root || parent._root == (xml_node_struct *)0x0) {
        return parent._root == (xml_node_struct *)0x0;
      }
      do {
        xml_node::xml_node(&local_20,(parent._root)->parent);
        bVar4 = local_20._root == (xml_node_struct *)0x0;
        if (bVar4) {
          return bVar4;
        }
        parent._root = local_20._root;
      } while (local_20._root != child._root);
      return bVar4;
    }
  }
  return false;
}

Assistant:

PUGI__FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}